

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetPropertyCommand.cxx
# Opt level: O3

bool anon_unknown.dwarf_6d04a8::HandleTargetMode
               (cmExecutionStatus *status,string *name,OutType infoType,string *variable,
               string *propertyName)

{
  bool bVar1;
  int iVar2;
  cmTarget *this;
  cmValue value;
  string *psVar3;
  cmGlobalGenerator *this_00;
  char *value_00;
  cmMakefile *pcVar4;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string local_98;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_78;
  size_type local_60;
  pointer local_58;
  undefined8 local_50;
  undefined8 local_48;
  char *local_40;
  undefined8 local_38;
  
  if (name->_M_string_length == 0) {
    local_78.first._M_len = (size_t)&local_78.second;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"not given name for TARGET scope.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    local_98.field_2._M_allocated_capacity = (size_type)local_78.second;
    local_98._M_dataplus._M_p = (pointer)local_78.first._M_len;
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)local_78.first._M_len
        == &local_78.second) {
      return false;
    }
  }
  else {
    this = cmMakefile::FindTargetToUse(status->Makefile,name,false);
    if (this != (cmTarget *)0x0) {
      iVar2 = std::__cxx11::string::compare((char *)propertyName);
      if ((iVar2 == 0) || (iVar2 = std::__cxx11::string::compare((char *)propertyName), iVar2 == 0))
      {
        bVar1 = cmMakefile::IsAlias(status->Makefile,name);
        if (bVar1) {
          iVar2 = std::__cxx11::string::compare((char *)propertyName);
          if (iVar2 == 0) {
            pcVar4 = status->Makefile;
            psVar3 = cmTarget::GetName_abi_cxx11_(this);
            value_00 = (psVar3->_M_dataplus)._M_p;
LAB_00248a5d:
            (anonymous_namespace)::StoreResult<char_const*>(infoType,pcVar4,variable,value_00);
            return true;
          }
          iVar2 = std::__cxx11::string::compare((char *)propertyName);
          if (iVar2 == 0) {
            pcVar4 = status->Makefile;
            this_00 = cmMakefile::GetGlobalGenerator(pcVar4);
            bVar1 = cmGlobalGenerator::IsAlias(this_00,name);
            value_00 = "FALSE";
            if (bVar1) {
              value_00 = "TRUE";
            }
            goto LAB_00248a5d;
          }
        }
        pcVar4 = status->Makefile;
        value.Value = (string *)0x0;
      }
      else {
        value = cmTarget::GetComputedProperty(this,propertyName,status->Makefile);
        if (value.Value == (string *)0x0) {
          value = cmTarget::GetProperty(this,propertyName);
        }
        pcVar4 = status->Makefile;
      }
      StoreResult<cmValue>(infoType,pcVar4,variable,value);
      return true;
    }
    local_78.first._M_len = 0x16;
    local_78.first._M_str = "could not find TARGET ";
    local_78.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_58 = (name->_M_dataplus)._M_p;
    local_60 = name->_M_string_length;
    local_50 = 0;
    local_48 = 0x27;
    local_40 = ".  Perhaps it has not yet been created.";
    local_38 = 0;
    views._M_len = 3;
    views._M_array = &local_78;
    cmCatViews(&local_98,views);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p == &local_98.field_2) {
      return false;
    }
  }
  operator_delete(local_98._M_dataplus._M_p,
                  (ulong)((long)&(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_98.field_2._M_allocated_capacity)->_M_dataplus)._M_p + 1
                         ));
  return false;
}

Assistant:

bool HandleTargetMode(cmExecutionStatus& status, const std::string& name,
                      OutType infoType, const std::string& variable,
                      const std::string& propertyName)
{
  if (name.empty()) {
    status.SetError("not given name for TARGET scope.");
    return false;
  }

  if (cmTarget* target = status.GetMakefile().FindTargetToUse(name)) {
    if (propertyName == "ALIASED_TARGET" || propertyName == "ALIAS_GLOBAL") {
      if (status.GetMakefile().IsAlias(name)) {
        if (propertyName == "ALIASED_TARGET") {

          return StoreResult(infoType, status.GetMakefile(), variable,
                             target->GetName().c_str());
        }
        if (propertyName == "ALIAS_GLOBAL") {
          return StoreResult(
            infoType, status.GetMakefile(), variable,
            status.GetMakefile().GetGlobalGenerator()->IsAlias(name)
              ? "TRUE"
              : "FALSE");
        }
      }
      return StoreResult(infoType, status.GetMakefile(), variable, nullptr);
    }
    cmValue prop =
      target->GetComputedProperty(propertyName, status.GetMakefile());
    if (!prop) {
      prop = target->GetProperty(propertyName);
    }
    return StoreResult(infoType, status.GetMakefile(), variable, prop);
  }
  status.SetError(cmStrCat("could not find TARGET ", name,
                           ".  Perhaps it has not yet been created."));
  return false;
}